

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O2

void Saig_ManFilterUsingInd2(Aig_Man_t *p,Vec_Vec_t *vCands,int nConfs,int nProps,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  Aig_Man_t *p_02;
  void *Entry;
  Vec_Ptr_t **ppVVar4;
  char *pcVar5;
  bool bVar6;
  Aig_Man_t *p_03;
  int in_R9D;
  int iVar7;
  int local_8c;
  
  p_00 = Saig_ManCreateIndMiter2(p,vCands);
  iVar1 = p_00->nObjs[3];
  iVar2 = Vec_VecSizeSize(vCands);
  if (iVar1 != iVar2 * 3) {
    __assert_fail("Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)*3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigUnfold2.c"
                  ,0x89,"void Saig_ManFilterUsingInd2(Aig_Man_t *, Vec_Vec_t *, int, int, int)");
  }
  p_01 = Cnf_DeriveSimple(p_00,p_00->nObjs[3]);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  if (fVerbose != 0) {
    puts("Filtered cands:  ");
  }
  bVar6 = true;
  iVar2 = 0;
  iVar1 = 0;
  do {
    if (vCands->nSize <= iVar2) {
      Cnf_DataFree(p_01);
      sat_solver_delete(s);
      if (fVerbose != 0) {
        Aig_ManPrintStats(p_00);
      }
      Aig_ManStop(p_00);
      return;
    }
    p_02 = (Aig_Man_t *)Vec_VecEntry(vCands,iVar2);
    if (!bVar6) {
      __assert_fail("i==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigUnfold2.c"
                    ,0x93,"void Saig_ManFilterUsingInd2(Aig_Man_t *, Vec_Vec_t *, int, int, int)");
    }
    local_8c = 0;
    for (iVar2 = 0; iVar7 = iVar1 + iVar2, iVar2 < *(int *)((long)&p_02->pName + 4);
        iVar2 = iVar2 + 1) {
      p_03 = p_02;
      Entry = Vec_PtrEntry((Vec_Ptr_t *)p_02,iVar2);
      iVar3 = Saig_ManFilterUsingIndOne2(p_03,p_00,s,p_01,nConfs,in_R9D,iVar7,0);
      if (iVar3 == -1) {
        Vec_PtrWriteEntry((Vec_Ptr_t *)p_02,local_8c,Entry);
        if (fVerbose != 0) {
          pcVar5 = "!";
          if (((ulong)Entry & 1) == 0) {
            pcVar5 = "";
          }
          printf("%d:%s%d \n",0,pcVar5,(ulong)*(uint *)(((ulong)Entry & 0xfffffffffffffffe) + 0x24))
          ;
        }
        pcVar5 = "!";
        if (((ulong)Entry & 1) == 0) {
          pcVar5 = "";
        }
        printf(" type I : %d:%s%d \n",0,pcVar5,
               (ulong)*(uint *)(((ulong)Entry & 0xfffffffffffffffe) + 0x24));
        ppVVar4 = &p->unfold2_type_I;
LAB_00514c4a:
        local_8c = local_8c + 1;
        Vec_PtrPush(*ppVVar4,Entry);
      }
      else {
        iVar3 = Saig_ManFilterUsingIndOne2(p_03,p_00,s,p_01,nConfs,in_R9D,iVar7,1);
        if ((iVar3 == 1) &&
           (iVar7 = Saig_ManFilterUsingIndOne2(p_03,p_00,s,p_01,nConfs,in_R9D,iVar7,2), iVar7 == -1)
           ) {
          pcVar5 = "!";
          if (fVerbose != 0) {
            if (((ulong)Entry & 1) == 0) {
              pcVar5 = "";
            }
            printf("%d:%s%d  \n",0,pcVar5,
                   (ulong)*(uint *)(((ulong)Entry & 0xfffffffffffffffe) + 0x24));
          }
          pcVar5 = "!";
          if (((ulong)Entry & 1) == 0) {
            pcVar5 = "";
          }
          printf(" type II: %d:%s%d  \n",0,pcVar5,
                 (ulong)*(uint *)(((ulong)Entry & 0xfffffffffffffffe) + 0x24));
          Vec_PtrWriteEntry((Vec_Ptr_t *)p_02,local_8c,Entry);
          ppVVar4 = &p->unfold2_type_II;
          goto LAB_00514c4a;
        }
      }
    }
    Vec_PtrShrink((Vec_Ptr_t *)p_02,local_8c);
    bVar6 = false;
    iVar2 = 1;
    iVar1 = iVar7;
  } while( true );
}

Assistant:

void Saig_ManFilterUsingInd2( Aig_Man_t * p, Vec_Vec_t * vCands, int nConfs, int nProps, int fVerbose )
{
  Vec_Ptr_t * vNodes;
  Aig_Man_t * pFrames;
  sat_solver * pSat;
  Cnf_Dat_t * pCnf;
  Aig_Obj_t * pObj;
  int i, k, k2, Counter;
  /*
    Vec_VecForEachLevel( vCands, vNodes, i )
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
    printf( "%d ", Aig_ObjId(Aig_Regular(pObj)) );
    printf( "\n" );
  */
  // create timeframes 
  //    pFrames = Saig_ManUnrollInd( p );
  pFrames = Saig_ManCreateIndMiter2( p, vCands );
  assert( Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)*3 );
  // start the SAT solver
  pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
  pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
  // check candidates
  if ( fVerbose )
    printf( "Filtered cands:  \n" );
  Counter = 0;
  Vec_VecForEachLevel( vCands, vNodes, i )
    {
      assert(i==0);             /* only one item */
      k2 = 0;
      Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
          if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter++ , 0) == l_False)
            //            if ( Saig_ManFilterUsingIndOne_old( p, pSat, pCnf, nConfs, pObj ) )
            {
              Vec_PtrWriteEntry( vNodes, k2++, pObj );
              if ( fVerbose )
                printf( "%d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
              printf( " type I : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
              Vec_PtrPush(p->unfold2_type_I, pObj);
            }
          /* jlong -- begin  */
          else if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter-1 , 1) == l_True ) /* can be self-conflicting */
            {
              if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter-1 , 2) == l_False ){
                //Vec_PtrWriteEntry( vNodes, k2++, pObj );
                if ( fVerbose )
                  printf( "%d:%s%d  \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( " type II: %d:%s%d  \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                Vec_PtrWriteEntry( vNodes, k2++, pObj ); /* add type II constraints */
                Vec_PtrPush(p->unfold2_type_II, pObj);
              }
            }
          /* jlong -- end  */
        }
      Vec_PtrShrink( vNodes, k2 );
    }

  // clean up
  Cnf_DataFree( pCnf );
  sat_solver_delete( pSat );
  if ( fVerbose )
    Aig_ManPrintStats( pFrames );
  Aig_ManStop( pFrames );
}